

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O2

int s3parse_comp_quest(pset_t *pset,uint32 n_pset,comp_quest_t *q,char *in_str)

{
  byte bVar1;
  ushort **ppuVar2;
  byte *pbVar3;
  quest_t **ppqVar4;
  uint32 *puVar5;
  long ln;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  
  pcVar7 = in_str + 1;
  while( true ) {
    bVar1 = pcVar7[-1];
    if ((ulong)bVar1 == 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
              ,0x107,"Empty string seen for composite question\n");
      return -1;
    }
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (ulong)bVar1 * 2 + 1) & 0x20) == 0) break;
    pcVar7 = pcVar7 + 1;
  }
  pbVar3 = (byte *)in_str;
  if (bVar1 == 0x28) {
    while (((ulong)*pbVar3 != 0 &&
           ((*(byte *)((long)*ppuVar2 + (ulong)*pbVar3 * 2 + 1) & 0x20) != 0))) {
      pbVar3 = pbVar3 + 1;
    }
    uVar6 = 0;
    while ((pbVar3[1] != 0 &&
           (pbVar3 = (byte *)strchr((char *)(pbVar3 + 1),0x28), pbVar3 != (byte *)0x0))) {
      uVar6 = uVar6 + 1;
    }
    q->sum_len = uVar6;
    ppqVar4 = (quest_t **)
              __ckd_calloc__((ulong)uVar6,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                             ,0x114);
    q->conj_q = ppqVar4;
    puVar5 = (uint32 *)
             __ckd_calloc__((ulong)q->sum_len,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                            ,0x115);
    q->prod_len = puVar5;
    uVar8 = 0;
    while( true ) {
      pcVar7 = s3parse_conj(pset,n_pset,q->conj_q + uVar8,q->prod_len + uVar8,pcVar7);
      if (pcVar7 == (char *)0x0) break;
      uVar8 = (ulong)((int)uVar8 + 1);
      if (*pcVar7 != '(') {
        return 0;
      }
    }
    pcVar7 = "Error while parsing %s\n";
    ln = 0x124;
  }
  else {
    pcVar7 = "Composite question does not begin with \'(\' : %s\n";
    ln = 0x10e;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
          ,ln,pcVar7,in_str);
  return -1;
}

Assistant:

int
s3parse_comp_quest(pset_t *pset,
		   uint32 n_pset,
		   comp_quest_t *q,
		   char *in_str)
{
    char *s;
    uint32 i;

    s = in_str;

    for (; *s != '\0' && isspace((unsigned char)*s); s++);

    if (*s == '\0') {
	E_ERROR("Empty string seen for composite question\n");

	return S3_ERROR;
    }

    if (*s != '(') {
	E_ERROR("Composite question does not begin with '(' : %s\n",
		in_str);
	
	return S3_ERROR;
    }
	
    q->sum_len  = s3cnt_q_term(in_str);
    q->conj_q   = (quest_t **)ckd_calloc(q->sum_len, sizeof(quest_t *));
    q->prod_len = (uint32 *)ckd_calloc(q->sum_len, sizeof(uint32));

    ++s;	/* skip the open paren */

    i = 0;
    do {
	s = s3parse_conj(pset,
			 n_pset,
			 &q->conj_q[i],
			 &q->prod_len[i],
			 s);
	++i;
    } while (s && *s && *s == '(');

    if (s == NULL) {
	E_ERROR("Error while parsing %s\n", in_str);

	return S3_ERROR;
    }

    return S3_SUCCESS;
}